

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O2

void __thiscall
Js::InterpreterStackFrame::OP_ScopedInitFunc<Js::LayoutSizePolicy<(Js::LayoutSize)2>>
          (InterpreterStackFrame *this,
          OpLayoutT_ElementScopedC<Js::LayoutSizePolicy<(Js::LayoutSize)2>_> *playout)

{
  PropertyId propertyId;
  FrameDisplay *pScope;
  Var newValue;
  Var defaultInstance;
  
  pScope = GetEnvForEvalCode(this);
  propertyId = FunctionBody::GetReferencedPropertyId
                         (*(FunctionBody **)(this + 0x88),playout->PropertyIdIndex);
  newValue = GetReg<unsigned_int>(this,playout->Value);
  defaultInstance = GetReg<unsigned_int>(this,1);
  JavascriptOperators::OP_InitFuncScoped
            (pScope,propertyId,newValue,defaultInstance,*(ScriptContext **)(this + 0x78));
  return;
}

Assistant:

void InterpreterStackFrame::OP_ScopedInitFunc(const unaligned OpLayoutT_ElementScopedC<T> * playout)
    {
        JavascriptOperators::OP_InitFuncScoped(GetEnvForEvalCode(),
            m_functionBody->GetReferencedPropertyId(playout->PropertyIdIndex),
            GetReg(playout->Value), GetReg(Js::FunctionBody::RootObjectRegSlot), GetScriptContext());
    }